

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_char,short>
          (BaseAppender *this,Vector *col,uchar input)

{
  short sVar1;
  short *psVar2;
  idx_t iVar3;
  long in_RDI;
  uchar unaff_retaddr;
  
  sVar1 = Cast::Operation<unsigned_char,short>(unaff_retaddr);
  psVar2 = FlatVector::GetData<short>((Vector *)0x941bd7);
  iVar3 = DataChunk::size((DataChunk *)(in_RDI + 0x48));
  psVar2[iVar3] = sVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}